

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O1

int Fraig_CheckTfi2(Fraig_Man_t *pMan,Fraig_Node_t *pOld,Fraig_Node_t *pNew)

{
  int iVar1;
  int iVar2;
  Fraig_NodeVec_t *vNodes;
  
  pMan->nTravIds = pMan->nTravIds + 1;
  vNodes = Fraig_NodeVecAlloc(100);
  Fraig_Dfs_rec(pMan,(Fraig_Node_t *)((ulong)pNew & 0xfffffffffffffffe),vNodes,1);
  iVar2 = pOld->TravId;
  iVar1 = pMan->nTravIds;
  Fraig_NodeVecFree(vNodes);
  return (int)(iVar2 == iVar1);
}

Assistant:

int Fraig_CheckTfi2( Fraig_Man_t * pMan, Fraig_Node_t * pOld, Fraig_Node_t * pNew )
{
    Fraig_NodeVec_t * vNodes;
    int RetValue;
    vNodes = Fraig_DfsOne( pMan, pNew, 1 );
    RetValue = (pOld->TravId == pMan->nTravIds);
    Fraig_NodeVecFree( vNodes );
    return RetValue;
}